

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O2

int match_tables(ip_tables_t *ipts,packet_t *pkt,ip_opt_t *opt)

{
  ip_chain_t *ipc;
  int iVar1;
  uint uVar2;
  int j;
  long lVar3;
  int i;
  ulong uVar4;
  uint8_t (*pauVar5) [5];
  uint8_t (*pauVar6) [5];
  double in_XMM0_Qa;
  
  if (ipts == (ip_tables_t *)0x0 || pkt == (packet_t *)0x0) {
    _log(in_XMM0_Qa);
    uVar2 = 6;
  }
  else {
    pauVar6 = (uint8_t (*) [5])&default_opt;
    if (opt != (ip_opt_t *)0x0) {
      pauVar6 = (uint8_t (*) [5])opt;
    }
    for (uVar4 = 0; uVar4 != 5; uVar4 = uVar4 + 1) {
      pauVar5 = pauVar6;
      for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
        if ((((*(uint8_t (*) [5])*pauVar5)[0] != '\0') && (ipts->tables[lVar3] != (ip_table_t *)0x0)
            ) && (ipc = ipts->tables[lVar3]->chains[uVar4], ipc != (ip_chain_t *)0x0)) {
          iVar1 = match_chain(ipc,pkt);
          if (iVar1 == 0) goto LAB_001045b9;
        }
        pauVar5 = pauVar5 + 1;
      }
      pauVar6 = (uint8_t (*) [5])(*pauVar6 + 1);
    }
LAB_001045b9:
    uVar2 = (uint)(4 < uVar4);
  }
  return uVar2;
}

Assistant:

int match_tables(ip_tables_t *ipts, packet_t *pkt, ip_opt_t *opt)
{
	if (ipts == NULL || pkt == NULL) {
		log_err("%s ipts or pkt is null\n", __FUNCTION__);
		return TARGET_NONE;
	}

	if (opt == NULL) {
		opt = &default_opt;
	}

	int target = TARGET_NONE;

	for (int i = 0; i < CHAIN_MAX; i++) {

		for (int j = 0; j < TABLE_MAX; j++) {

			if (opt->list[j][i] == 0 || ipts->tables[j] == NULL || ipts->tables[j]->chains[i] == NULL) {
				continue;
			}

			target = match_chain(ipts->tables[j]->chains[i], pkt);

			if (target == TARGET_DROP) {
				return TARGET_DROP;
			}
		}
	}
	return TARGET_ACCEPT;
}